

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCore_impl.hpp
# Opt level: O1

string * __thiscall
helics::NetworkCore<helics::inproc::InprocComms,(gmlc::networking::InterfaceTypes)4>::
generateLocalAddressString_abi_cxx11_
          (string *__return_storage_ptr__,
          NetworkCore<helics::inproc::InprocComms,(gmlc::networking::InterfaceTypes)4> *this)

{
  bool bVar1;
  int iVar2;
  string *__str;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar1 = CommsInterface::isConnected(*(CommsInterface **)(this + 0xd88));
  if (bVar1) {
    inproc::InprocComms::getAddress_abi_cxx11_(&local_40,*(InprocComms **)(this + 0xd88));
    generateLocalAddressString_abi_cxx11_();
  }
  else {
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)(this + 0xd98));
    if (iVar2 != 0) {
      std::__throw_system_error(iVar2);
    }
    if (*(long *)(this + 0xe08) == 0) {
      __str = CommonCore::getIdentifier_abi_cxx11_((CommonCore *)this);
    }
    else {
      __str = (string *)(this + 0xe00);
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
    pthread_mutex_unlock((pthread_mutex_t *)(this + 0xd98));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string NetworkCore<COMMS, baseline>::generateLocalAddressString() const
{
    std::string add;
    if (CommsBroker<COMMS, CommonCore>::comms->isConnected()) {
        add = CommsBroker<COMMS, CommonCore>::comms->getAddress();
    } else {
        std::lock_guard<std::mutex> lock(dataMutex);
        switch (baseline) {
            case InterfaceTypes::TCP:
            case InterfaceTypes::IP:
            case InterfaceTypes::UDP:
                if (!netInfo.localInterface.empty() && (netInfo.localInterface.back() == '*')) {
                    add = gmlc::networking::makePortAddress(
                        netInfo.localInterface.substr(0, netInfo.localInterface.size() - 1),
                        netInfo.portNumber);
                } else {
                    add = gmlc::networking::makePortAddress(netInfo.localInterface,
                                                            netInfo.portNumber);
                }
                break;
            case InterfaceTypes::INPROC:
            case InterfaceTypes::IPC:
            default:
                if (!netInfo.localInterface.empty()) {
                    add = netInfo.localInterface;
                } else {
                    add = CommonCore::getIdentifier();
                }
                break;
        }
    }
    return add;
}